

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * fts3HashMalloc(sqlite3_int64 n)

{
  void *pvVar1;
  
  pvVar1 = sqlite3_malloc64(n);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,n);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

static void *fts3HashMalloc(sqlite3_int64 n){
  void *p = sqlite3_malloc64(n);
  if( p ){
    memset(p, 0, n);
  }
  return p;
}